

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O2

int gz_skip(gz_statep state,long len)

{
  uchar **ppuVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  do {
    if (len == 0) {
      return 0;
    }
    while( true ) {
      uVar3 = (state->x).have;
      if ((ulong)uVar3 != 0) break;
      if ((state->eof != 0) && ((state->strm).avail_in == 0)) {
        return 0;
      }
      iVar4 = gz_fetch(state);
      if (iVar4 == -1) {
        return -(uint)(iVar4 == -1);
      }
      if (len == 0) {
        return -(uint)(iVar4 == -1);
      }
    }
    uVar5 = len & 0xffffffff;
    if ((long)(ulong)uVar3 <= len) {
      uVar5 = (ulong)uVar3;
    }
    (state->x).have = uVar3 - (int)uVar5;
    ppuVar1 = &(state->x).next;
    *ppuVar1 = *ppuVar1 + uVar5;
    plVar2 = &(state->x).pos;
    *plVar2 = *plVar2 + uVar5;
    len = len - uVar5;
  } while( true );
}

Assistant:

local int gz_skip(gz_statep state, z_off64_t len) {
    unsigned n;

    /* skip over len bytes or reach end-of-file, whichever comes first */
    while (len)
        /* skip over whatever is in output buffer */
        if (state->x.have) {
            n = GT_OFF(state->x.have) || (z_off64_t)state->x.have > len ?
                (unsigned)len : state->x.have;
            state->x.have -= n;
            state->x.next += n;
            state->x.pos += n;
            len -= n;
        }

        /* output buffer empty -- return if we're at the end of the input */
        else if (state->eof && state->strm.avail_in == 0)
            break;

        /* need more data to skip -- load up output buffer */
        else {
            /* get more output, looking for header if required */
            if (gz_fetch(state) == -1)
                return -1;
        }
    return 0;
}